

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathEuler.h
# Opt level: O0

void __thiscall Imath_3_2::Euler<float>::extract(Euler<float> *this,Matrix44<float> *M)

{
  float fVar1;
  float *pfVar2;
  Matrix44<float> *in_RSI;
  Vec3<float> *in_RDI;
  double dVar3;
  float t;
  float cy;
  Matrix44<float> N_1;
  Vec3<float> r_1;
  float sy;
  Matrix44<float> N;
  Vec3<float> r;
  int k;
  int j;
  int i;
  undefined4 in_stack_fffffffffffffe80;
  float fVar4;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffe88;
  float fVar5;
  undefined4 in_stack_fffffffffffffe8c;
  float local_170;
  float local_150;
  Vec3<float> *in_stack_fffffffffffffef8;
  Matrix44<float> *in_stack_ffffffffffffff00;
  Matrix44<float> local_f8;
  Vec3<float> local_b8;
  undefined4 local_ac;
  Matrix44<float> local_a8;
  Matrix44<float> local_68;
  Vec3<float> local_28;
  int local_1c;
  int local_18;
  int local_14;
  Matrix44<float> *local_10;
  
  local_10 = in_RSI;
  angleOrder((Euler<float> *)in_RDI,&local_14,&local_18,&local_1c);
  if ((*(byte *)&in_RDI[1].x >> 1 & 1) == 0) {
    pfVar2 = Matrix44<float>::operator[](local_10,local_18);
    fVar1 = pfVar2[local_1c];
    pfVar2 = Matrix44<float>::operator[](local_10,local_1c);
    dVar3 = std::atan2((double)(ulong)(uint)fVar1,(double)(ulong)(uint)pfVar2[local_1c]);
    in_RDI->x = SUB84(dVar3,0);
    Vec3<float>::Vec3(&local_b8,0.0,0.0,0.0);
    if ((*(byte *)&in_RDI[1].x >> 2 & 1) == 0) {
      local_170 = in_RDI->x;
    }
    else {
      local_170 = -in_RDI->x;
    }
    pfVar2 = Vec3<float>::operator[](&local_b8,local_14);
    *pfVar2 = local_170;
    Matrix44<float>::Matrix44(&local_f8);
    Matrix44<float>::rotate<float>(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    Matrix44<float>::operator*
              ((Matrix44<float> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
               (Matrix44<float> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    Matrix44<float>::operator=(&local_f8,(Matrix44<float> *)&stack0xfffffffffffffec8);
    pfVar2 = Matrix44<float>::operator[](&local_f8,local_14);
    fVar1 = pfVar2[local_14];
    pfVar2 = Matrix44<float>::operator[](&local_f8,local_14);
    fVar5 = pfVar2[local_14];
    pfVar2 = Matrix44<float>::operator[](&local_f8,local_14);
    fVar4 = pfVar2[local_18];
    pfVar2 = Matrix44<float>::operator[](&local_f8,local_14);
    dVar3 = std::sqrt((double)(ulong)(uint)(fVar1 * fVar5 + fVar4 * pfVar2[local_18]));
    pfVar2 = Matrix44<float>::operator[](&local_f8,local_14);
    dVar3 = std::atan2((double)(ulong)(uint)-pfVar2[local_1c],(double)((ulong)dVar3 & 0xffffffff));
    in_RDI->y = SUB84(dVar3,0);
    pfVar2 = Matrix44<float>::operator[](&local_f8,local_18);
    fVar1 = -pfVar2[local_14];
    pfVar2 = Matrix44<float>::operator[](&local_f8,local_18);
    dVar3 = std::atan2((double)(ulong)(uint)fVar1,(double)(ulong)(uint)pfVar2[local_18]);
    in_RDI->z = SUB84(dVar3,0);
  }
  else {
    pfVar2 = Matrix44<float>::operator[](local_10,local_18);
    fVar1 = pfVar2[local_14];
    pfVar2 = Matrix44<float>::operator[](local_10,local_1c);
    dVar3 = std::atan2((double)(ulong)(uint)fVar1,(double)(ulong)(uint)pfVar2[local_14]);
    in_RDI->x = SUB84(dVar3,0);
    Vec3<float>::Vec3(&local_28,0.0,0.0,0.0);
    if ((*(byte *)&in_RDI[1].x >> 2 & 1) == 0) {
      local_150 = in_RDI->x;
    }
    else {
      local_150 = -in_RDI->x;
    }
    pfVar2 = Vec3<float>::operator[](&local_28,local_14);
    *pfVar2 = local_150;
    Matrix44<float>::Matrix44(&local_68);
    Matrix44<float>::rotate<float>(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    Matrix44<float>::operator*
              ((Matrix44<float> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
               (Matrix44<float> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    Matrix44<float>::operator=(&local_68,&local_a8);
    pfVar2 = Matrix44<float>::operator[](&local_68,local_18);
    fVar1 = pfVar2[local_14];
    pfVar2 = Matrix44<float>::operator[](&local_68,local_18);
    fVar5 = pfVar2[local_14];
    pfVar2 = Matrix44<float>::operator[](&local_68,local_1c);
    fVar4 = pfVar2[local_14];
    pfVar2 = Matrix44<float>::operator[](&local_68,local_1c);
    dVar3 = std::sqrt((double)(ulong)(uint)(fVar1 * fVar5 + fVar4 * pfVar2[local_14]));
    local_ac = SUB84(dVar3,0);
    pfVar2 = Matrix44<float>::operator[](&local_68,local_14);
    dVar3 = std::atan2((double)((ulong)dVar3 & 0xffffffff),(double)(ulong)(uint)pfVar2[local_14]);
    in_RDI->y = SUB84(dVar3,0);
    pfVar2 = Matrix44<float>::operator[](&local_68,local_18);
    fVar1 = pfVar2[local_1c];
    pfVar2 = Matrix44<float>::operator[](&local_68,local_18);
    dVar3 = std::atan2((double)(ulong)(uint)fVar1,(double)(ulong)(uint)pfVar2[local_18]);
    in_RDI->z = SUB84(dVar3,0);
  }
  if ((*(byte *)&in_RDI[1].x >> 2 & 1) == 0) {
    Vec3<float>::operator*=(in_RDI,-1.0);
  }
  if (((uint)in_RDI[1].x & 1) == 0) {
    fVar1 = in_RDI->x;
    in_RDI->x = in_RDI->z;
    in_RDI->z = fVar1;
  }
  return;
}

Assistant:

IMATH_HOSTDEVICE void
Euler<T>::extract (const Matrix44<T>& M) IMATH_NOEXCEPT
{
    int i, j, k;
    angleOrder (i, j, k);

    if (_initialRepeated)
    {
        //
        // Extract the first angle, x.
        //

        x = std::atan2 (M[j][i], M[k][i]);

        //
        // Remove the x rotation from M, so that the remaining
        // rotation, N, is only around two axes, and gimbal lock
        // cannot occur.
        //

        Vec3<T> r (0, 0, 0);
        r[i] = (_parityEven ? -x : x);

        Matrix44<T> N;
        N.rotate (r);
        N = N * M;

        //
        // Extract the other two angles, y and z, from N.
        //

        T sy = std::sqrt (N[j][i] * N[j][i] + N[k][i] * N[k][i]);
        y    = std::atan2 (sy, N[i][i]);
        z    = std::atan2 (N[j][k], N[j][j]);
    }
    else
    {
        //
        // Extract the first angle, x.
        //

        x = std::atan2 (M[j][k], M[k][k]);

        //
        // Remove the x rotation from M, so that the remaining
        // rotation, N, is only around two axes, and gimbal lock
        // cannot occur.
        //

        Vec3<T> r (0, 0, 0);
        r[i] = (_parityEven ? -x : x);

        Matrix44<T> N;
        N.rotate (r);
        N = N * M;

        //
        // Extract the other two angles, y and z, from N.
        //

        T cy = std::sqrt (N[i][i] * N[i][i] + N[i][j] * N[i][j]);
        y    = std::atan2 (-N[i][k], cy);
        z    = std::atan2 (-N[j][i], N[j][j]);
    }

    if (!_parityEven) *this *= -1;

    if (!_frameStatic)
    {
        T t = x;
        x   = z;
        z   = t;
    }
}